

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

void Sbl_ManUpdateMapping(Sbl_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  word wVar5;
  word wVar6;
  word wVar7;
  word wVar8;
  int iVar9;
  ulong uVar10;
  
  if (p->vSolInit->nSize <= p->vSolBest->nSize) {
    __assert_fail("Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                  ,0x218,"void Sbl_ManUpdateMapping(Sbl_Man_t *)");
  }
  iVar9 = 0;
  do {
    if (p->vAnds->nSize <= iVar9) {
      iVar9 = 0;
      do {
        if (p->vSolBest->nSize <= iVar9) {
          return;
        }
        iVar2 = Vec_IntEntry(p->vSolBest,iVar9);
        wVar5 = Vec_WrdEntry(p->vCutsI1,iVar2);
        wVar6 = Vec_WrdEntry(p->vCutsI2,iVar2);
        wVar7 = Vec_WrdEntry(p->vCutsN1,iVar2);
        wVar8 = Vec_WrdEntry(p->vCutsN2,iVar2);
        iVar2 = Vec_IntEntry(p->vCutsObj,iVar2);
        iVar2 = Vec_IntEntry(p->vAnds,iVar2);
        pVVar4 = Vec_WecEntry(p->pGia->vMapping2,iVar2);
        pVVar4->nSize = 0;
        for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
          if ((wVar5 >> (uVar10 & 0x3f) & 1) != 0) {
            iVar2 = Vec_IntEntry(p->vLeaves,(int)uVar10);
            Vec_IntPush(pVVar4,iVar2);
          }
        }
        for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
          if ((wVar6 >> (uVar10 & 0x3f) & 1) != 0) {
            iVar2 = Vec_IntEntry(p->vLeaves,(uint)uVar10 | 0x40);
            Vec_IntPush(pVVar4,iVar2);
          }
        }
        for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
          if ((wVar7 >> (uVar10 & 0x3f) & 1) != 0) {
            iVar2 = Vec_IntEntry(p->vAnds,(int)uVar10);
            Vec_IntPush(pVVar4,iVar2);
          }
        }
        for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
          if ((wVar8 >> (uVar10 & 0x3f) & 1) != 0) {
            iVar2 = Vec_IntEntry(p->vAnds,(uint)uVar10 | 0x40);
            Vec_IntPush(pVVar4,iVar2);
          }
        }
        for (iVar2 = 0; iVar2 < pVVar4->nSize; iVar2 = iVar2 + 1) {
          iVar3 = Vec_IntEntry(pVVar4,iVar2);
          piVar1 = p->pGia->pLutRefs;
          if (piVar1 == (int *)0x0) {
            __assert_fail("p->pLutRefs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x234,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
          }
          piVar1 = piVar1 + iVar3;
          *piVar1 = *piVar1 + 1;
        }
        iVar9 = iVar9 + 1;
      } while( true );
    }
    iVar2 = Vec_IntEntry(p->vAnds,iVar9);
    pVVar4 = Vec_WecEntry(p->pGia->vMapping2,iVar2);
    for (iVar2 = 0; iVar2 < pVVar4->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar4,iVar2);
      piVar1 = p->pGia->pLutRefs;
      if (piVar1 == (int *)0x0) {
        __assert_fail("p->pLutRefs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x235,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
      }
      piVar1 = piVar1 + iVar3;
      *piVar1 = *piVar1 + -1;
    }
    pVVar4->nSize = 0;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void Sbl_ManUpdateMapping( Sbl_Man_t * p )
{
//    Gia_Obj_t * pObj;
    Vec_Int_t * vObj;
    word CutI1, CutI2, CutN1, CutN2;
    int i, c, b, iObj, iTemp; 
    assert( Vec_IntSize(p->vSolBest) < Vec_IntSize(p->vSolInit) );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        vObj = Vec_WecEntry(p->pGia->vMapping2, iObj);
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
        Vec_IntClear( vObj );
    }
    Vec_IntForEachEntry( p->vSolBest, c, i )
    {
        CutI1 = Vec_WrdEntry( p->vCutsI1, c );
        CutI2 = Vec_WrdEntry( p->vCutsI2, c );
        CutN1 = Vec_WrdEntry( p->vCutsN1, c );
        CutN2 = Vec_WrdEntry( p->vCutsN2, c );
        iObj = Vec_IntEntry( p->vCutsObj, c );
        iObj = Vec_IntEntry( p->vAnds, iObj );
        vObj = Vec_WecEntry( p->pGia->vMapping2, iObj );
        Vec_IntClear( vObj );
        assert( Vec_IntSize(vObj) == 0 );
        for ( b = 0; b < 64; b++ )
            if ( (CutI1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutI2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vLeaves, 64+b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN1 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, b) );
        for ( b = 0; b < 64; b++ )
            if ( (CutN2 >> b) & 1 )
                Vec_IntPush( vObj, Vec_IntEntry(p->vAnds, 64+b) );
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
    }
/*
    // verify
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefDecId( p->pGia, iTemp );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefDecId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );

    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        if ( p->pGia->pLutRefs[i] )
            printf( "Object %d has %d refs\n", i, p->pGia->pLutRefs[i] );

    Gia_ManForEachCo( p->pGia, pObj, i )
        Gia_ObjLutRefIncId( p->pGia, Gia_ObjFaninId0p(p->pGia, pObj) );
    Gia_ManForEachLut2Vec( p->pGia, vObj, i )
        Vec_IntForEachEntry( vObj, iTemp, b )
            Gia_ObjLutRefIncId( p->pGia, iTemp );
*/
}